

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_blend.cpp
# Opt level: O0

void V_AddBlend(float r,float g,float b,float a,float *v_blend)

{
  float fVar1;
  float fVar2;
  float a3;
  float a2;
  float *v_blend_local;
  float a_local;
  float b_local;
  float g_local;
  float r_local;
  
  if (0.0 < a) {
    fVar1 = v_blend[3] + (1.0 - v_blend[3]) * a;
    fVar2 = v_blend[3] / fVar1;
    *v_blend = *v_blend * fVar2 + r * (1.0 - fVar2);
    v_blend[1] = v_blend[1] * fVar2 + g * (1.0 - fVar2);
    v_blend[2] = v_blend[2] * fVar2 + b * (1.0 - fVar2);
    v_blend[3] = fVar1;
  }
  return;
}

Assistant:

void V_AddBlend (float r, float g, float b, float a, float v_blend[4])
{
	float a2, a3;

	if (a <= 0)
		return;
	a2 = v_blend[3] + (1-v_blend[3])*a;	// new total alpha
	a3 = v_blend[3]/a2;		// fraction of color from old

	v_blend[0] = v_blend[0]*a3 + r*(1-a3);
	v_blend[1] = v_blend[1]*a3 + g*(1-a3);
	v_blend[2] = v_blend[2]*a3 + b*(1-a3);
	v_blend[3] = a2;
}